

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_collector.hpp
# Opt level: O2

void __thiscall
duckdb::BatchCollectorGlobalState::~BatchCollectorGlobalState(BatchCollectorGlobalState *this)

{
  ~BatchCollectorGlobalState(this);
  operator_delete(this);
  return;
}

Assistant:

BatchCollectorGlobalState(ClientContext &context, const PhysicalBatchCollector &op) : data(context, op.types) {
	}